

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

void __thiscall icu_63::CalendarAstronomer::CalendarAstronomer(CalendarAstronomer *this,UDate d)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 uVar6;
  undefined4 uVar7;
  
  this->fTime = d;
  this->fLongitude = 0.0;
  this->fLatitude = 0.0;
  this->fGmtOffset = 0.0;
  (this->moonPosition).ascension = 0.0;
  (this->moonPosition).declination = 0.0;
  this->moonPositionSet = '\0';
  dVar1 = uprv_getNaN_63();
  uVar6 = SUB84(dVar1,0);
  uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
  auVar2._8_4_ = uVar6;
  auVar2._0_8_ = dVar1;
  auVar2._12_4_ = uVar7;
  this->sunLongitude = dVar1;
  this->meanAnomalySun = (double)auVar2._8_8_;
  auVar3._8_4_ = uVar6;
  auVar3._0_8_ = dVar1;
  auVar3._12_4_ = uVar7;
  this->julianDay = dVar1;
  this->julianCentury = (double)auVar3._8_8_;
  auVar4._8_4_ = uVar6;
  auVar4._0_8_ = dVar1;
  auVar4._12_4_ = uVar7;
  this->meanAnomalyMoon = dVar1;
  this->eclipObliquity = (double)auVar4._8_8_;
  auVar5._8_4_ = uVar6;
  auVar5._0_8_ = dVar1;
  auVar5._12_4_ = uVar7;
  this->moonLongitude = dVar1;
  this->moonEclipLong = (double)auVar5._8_8_;
  this->siderealTime = dVar1;
  this->siderealT0 = dVar1;
  this->moonPositionSet = '\0';
  return;
}

Assistant:

CalendarAstronomer::CalendarAstronomer(UDate d): fTime(d), fLongitude(0.0), fLatitude(0.0), fGmtOffset(0.0), moonPosition(0,0), moonPositionSet(FALSE) {
  clearCache();
}